

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

int best_index_int8(int n,int8_t *val,float x)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  
  iVar4 = 0;
  if (-127.0 < x) {
    if (113.0 <= x) {
      return 0xf;
    }
    iVar4 = 0;
    for (uVar3 = 0xf; iVar2 = (int)uVar3, 1 < iVar2 - iVar4; uVar3 = uVar3 & 0xffffffff) {
      uVar1 = (long)(iVar2 + iVar4) / 2;
      iVar2 = (int)uVar1;
      if (x < (float)(int)kvalues_iq4nl[iVar2]) {
        uVar3 = uVar1;
        iVar2 = iVar4;
      }
      iVar4 = iVar2;
    }
    iVar4 = iVar2 + -1;
    if ((float)(int)kvalues_iq4nl[iVar2] - x <= x - (float)(int)(char)(&UNK_0014f64f)[iVar2]) {
      iVar4 = iVar2;
    }
  }
  return iVar4;
}

Assistant:

static inline int best_index_int8(int n, const int8_t * val, float x) {
    if (x <= val[0]) return 0;
    if (x >= val[n-1]) return n-1;
    int ml = 0, mu = n-1;
    while (mu-ml > 1) {
        int mav = (ml+mu)/2;
        if (x < val[mav]) mu = mav; else ml = mav;
    }
    return x - val[mu-1] < val[mu] - x ? mu-1 : mu;
}